

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalAllocateReaders(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pnToken,int *pnOr,int *pRc)

{
  int iVar1;
  int iVar2;
  Fts3PhraseToken *pFVar3;
  int rc;
  Fts3PhraseToken *pToken;
  int nToken;
  int i;
  int *pRc_local;
  int *pnOr_local;
  int *pnToken_local;
  Fts3Expr *pExpr_local;
  Fts3Cursor *pCsr_local;
  
  if ((pExpr != (Fts3Expr *)0x0) && (*pRc == 0)) {
    if (pExpr->eType == 5) {
      iVar1 = pExpr->pPhrase->nToken;
      *pnToken = iVar1 + *pnToken;
      for (pToken._4_4_ = 0; pToken._4_4_ < iVar1; pToken._4_4_ = pToken._4_4_ + 1) {
        pFVar3 = pExpr->pPhrase->aToken + pToken._4_4_;
        iVar2 = fts3TermSegReaderCursor(pCsr,pFVar3->z,pFVar3->n,pFVar3->isPrefix,&pFVar3->pSegcsr);
        if (iVar2 != 0) {
          *pRc = iVar2;
          return;
        }
      }
      pExpr->pPhrase->iDoclistToken = -1;
    }
    else {
      *pnOr = (uint)(pExpr->eType == 4) + *pnOr;
      fts3EvalAllocateReaders(pCsr,pExpr->pLeft,pnToken,pnOr,pRc);
      fts3EvalAllocateReaders(pCsr,pExpr->pRight,pnToken,pnOr,pRc);
    }
  }
  return;
}

Assistant:

static void fts3EvalAllocateReaders(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Allocate readers for this expression */
  int *pnToken,                   /* OUT: Total number of tokens in phrase. */
  int *pnOr,                      /* OUT: Total number of OR nodes in expr. */
  int *pRc                        /* IN/OUT: Error code */
){
  if( pExpr && SQLITE_OK==*pRc ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      int i;
      int nToken = pExpr->pPhrase->nToken;
      *pnToken += nToken;
      for(i=0; i<nToken; i++){
        Fts3PhraseToken *pToken = &pExpr->pPhrase->aToken[i];
        int rc = fts3TermSegReaderCursor(pCsr, 
            pToken->z, pToken->n, pToken->isPrefix, &pToken->pSegcsr
        );
        if( rc!=SQLITE_OK ){
          *pRc = rc;
          return;
        }
      }
      assert( pExpr->pPhrase->iDoclistToken==0 );
      pExpr->pPhrase->iDoclistToken = -1;
    }else{
      *pnOr += (pExpr->eType==FTSQUERY_OR);
      fts3EvalAllocateReaders(pCsr, pExpr->pLeft, pnToken, pnOr, pRc);
      fts3EvalAllocateReaders(pCsr, pExpr->pRight, pnToken, pnOr, pRc);
    }
  }
}